

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O3

double xc_bessel_K0(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (x <= 0.0) {
    xc_bessel_K0_cold_1();
    dVar3 = 0.0;
  }
  else if (x <= 2.0) {
    dVar4 = log(x * 0.5);
    dVar5 = xc_bessel_I0(x);
    dVar8 = x * 0.5 * x + -1.0;
    uVar1 = 0xc;
    dVar3 = 0.0;
    dVar2 = 0.0;
    do {
      dVar6 = dVar3;
      dVar7 = ((dVar8 + dVar8) * dVar2 - dVar6) + ai12_data[uVar1 + 0x14];
      uVar1 = uVar1 - 1;
      dVar3 = dVar2;
      dVar2 = dVar7;
    } while (1 < uVar1);
    dVar3 = (dVar7 - dVar6) * 0.5 + (-0.25 - dVar4 * dVar5);
  }
  else {
    dVar2 = exp(-x);
    dVar3 = xc_bessel_K0_scaled(x);
    dVar3 = dVar3 * dVar2;
  }
  return dVar3;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K0(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K0\n");
#endif
  } else if(x <= 2.0)
    r = -log(0.5*x)*xc_bessel_I0(x) - 0.25 + xc_cheb_eval(0.5*x*x - 1.0, bk0_data, 11);
  else
    r = exp(-x)*xc_bessel_K0_scaled(x);

  return r;
}